

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O3

void handleFramePoseOptions(KinDynComputations *comp,parser *cmd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *poVar7;
  string frameName;
  string referenceFrameName;
  Transform referenceFrame_H_name;
  long *local_170;
  long local_168;
  long local_160 [2];
  char *local_150;
  long local_148;
  char local_140;
  undefined7 uStack_13f;
  string local_130 [4];
  string local_b0;
  string local_90 [96];
  
  psVar5 = (string *)iDynTree::KinDynComputations::getRobotModel();
  paVar1 = &local_130[0].field_2;
  local_130[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"frame-pose","");
  bVar3 = cmdline::parser::exist(cmd,local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_130[0]._M_dataplus._M_p,local_130[0].field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return;
  }
  local_130[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"frame-pose","");
  pbVar6 = cmdline::parser::get<std::__cxx11::string>(cmd,local_130);
  local_170 = local_160;
  pcVar2 = (pbVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar2,pcVar2 + pbVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_130[0]._M_dataplus._M_p,local_130[0].field_2._M_allocated_capacity + 1);
  }
  local_148 = 0;
  local_140 = '\0';
  local_150 = &local_140;
  local_130[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"frame-pose-reference-frame","");
  bVar3 = cmdline::parser::exist(cmd,local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_130[0]._M_dataplus._M_p,local_130[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_130[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"frame-pose-reference-frame","");
    cmdline::parser::get<std::__cxx11::string>(cmd,local_130);
    std::__cxx11::string::_M_assign((string *)&local_150);
  }
  else {
    iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getDefaultBaseLink();
    iDynTree::Model::getFrameName_abi_cxx11_((long)local_130);
    std::__cxx11::string::operator=((string *)&local_150,(string *)local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_130[0]._M_dataplus._M_p,local_130[0].field_2._M_allocated_capacity + 1);
  }
  iDynTree::Model::getFrameIndex(psVar5);
  cVar4 = iDynTree::Model::isValidFrameIndex((long)psVar5);
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Frame ",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_170,local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," not found in the model",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  else {
    iDynTree::Model::getFrameIndex(psVar5);
    cVar4 = iDynTree::Model::isValidFrameIndex((long)psVar5);
    if (cVar4 != '\0') {
      iDynTree::KinDynComputations::getRelativeTransform(local_90,(string *)comp);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_150,local_148);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_H_",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_170,local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," is \n",5);
      iDynTree::Transform::asHomogeneousTransform();
      iDynTree::MatrixFixSize<4u,4u>::toString_abi_cxx11_(&local_b0,local_130);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001051f1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Frame ",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_150,local_148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," not found in the model",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  std::ostream::put((char)poVar7);
  std::ostream::flush();
LAB_001051f1:
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  return;
}

Assistant:

void handleFramePoseOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    using namespace iDynTree;

    const Model & model = comp.getRobotModel();

    if( !cmd.exist("frame-pose") )
    {
        return;
    }

    std::string frameName = cmd.get<std::string>("frame-pose");

    std::string referenceFrameName;
    if( cmd.exist("frame-pose-reference-frame") )
    {
        referenceFrameName = cmd.get<std::string>("frame-pose-reference-frame");
    }
    else
    {
        referenceFrameName = model.getFrameName(comp.getRobotModel().getDefaultBaseLink());
    }

    if( !model.isValidFrameIndex(model.getFrameIndex(frameName)) )
    {
        std::cerr << "Frame " << frameName << " not found in the model" << std::endl;
	return;
    }

    if( !model.isValidFrameIndex(model.getFrameIndex(referenceFrameName)) )
    {
        std::cerr << "Frame " << referenceFrameName << " not found in the model" << std::endl;
	return;
    }

    Transform referenceFrame_H_name = comp.getRelativeTransform(referenceFrameName,frameName);


    std::cout << referenceFrameName << "_H_" << frameName << " is \n" << referenceFrame_H_name.asHomogeneousTransform().toString() << std::endl;
}